

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_udp_ref3(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t h;
  uv_udp_send_t req;
  uv_buf_t local_240;
  sockaddr_in local_230;
  uv_udp_t local_220;
  uv_udp_send_t local_148;
  
  local_240 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_230);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    uv_udp_init(puVar2,&local_220);
    uv_udp_send(&local_148,&local_220,&local_240,1,(sockaddr *)&local_230,req_cb);
    uv_unref((uv_handle_t *)&local_220);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (req_cb_called == 1) {
      do_close(&local_220);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001739a6;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001739a6:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_ref3) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_send_t req;
  uv_udp_t h;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_send(&req,
              &h,
              &buf,
              1,
              (const struct sockaddr*) &addr,
              (uv_udp_send_cb) req_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(req_cb_called == 1);
  do_close(&h);

  MAKE_VALGRIND_HAPPY();
  return 0;
}